

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayFeatureExtractor.pb.cc
# Opt level: O0

ArrayFeatureExtractor * __thiscall
CoreML::Specification::ArrayFeatureExtractor::New(ArrayFeatureExtractor *this,Arena *arena)

{
  ArrayFeatureExtractor *this_00;
  ArrayFeatureExtractor *n;
  Arena *arena_local;
  ArrayFeatureExtractor *this_local;
  
  this_00 = (ArrayFeatureExtractor *)operator_new(0x28);
  ArrayFeatureExtractor(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::ArrayFeatureExtractor>(arena,this_00);
  }
  return this_00;
}

Assistant:

ArrayFeatureExtractor* ArrayFeatureExtractor::New(::google::protobuf::Arena* arena) const {
  ArrayFeatureExtractor* n = new ArrayFeatureExtractor;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}